

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

int Cec2_ManPerformSweeping(Gia_Man_t *p,Cec2_Par_t *pPars,Gia_Man_t **ppNew)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Cec2_Man_t *pMan_00;
  Abc_Cex_t *pAVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  int Fails;
  int fDisproved;
  int Iter;
  int i;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Cec2_Man_t *pMan;
  Gia_Man_t **ppNew_local;
  Cec2_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  pMan_00 = Cec2_ManCreate(p,pPars);
  bVar9 = true;
  Gia_ManRandomW(1);
  Gia_ManSetPhase(p);
  if (pPars->fIsMiter == 0) {
LAB_007fab81:
    Cec2_ManSimAlloc(p,pPars->nSimWords);
    Cec2_ManSimulateCis(p);
    Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan_00);
    if ((pPars->fIsMiter == 0) || (iVar1 = Cec2_ManSimulateCos(p), iVar1 != 0)) {
      Cec2_ManCreateClasses(p,pMan_00);
      Cec2_ManPrintStats(p,pPars,pMan_00);
      for (fDisproved = 0; fDisproved < pPars->nSimRounds; fDisproved = fDisproved + 1) {
        Cec2_ManSimulateCis(p);
        Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan_00);
        if ((pPars->fIsMiter != 0) && (iVar1 = Cec2_ManSimulateCos(p), iVar1 == 0))
        goto LAB_007fb269;
        Cec2_ManPrintStats(p,pPars,pMan_00);
      }
      Fails = 0;
      while( true ) {
        bVar8 = false;
        if (bVar9) {
          bVar8 = Fails < pPars->nItersMax;
        }
        if (!bVar8) break;
        bVar9 = false;
        pMan_00->nPatterns = 0;
        Cec2_ManSimulateCis(p);
        Vec_IntClear(pMan_00->vCexTriples);
        fDisproved = 0;
        while( true ) {
          bVar8 = false;
          if (fDisproved < p->nObjs) {
            pRepr = Gia_ManObj(p,fDisproved);
            bVar8 = pRepr != (Gia_Obj_t *)0x0;
          }
          if (!bVar8) break;
          iVar1 = Gia_ObjIsAnd(pRepr);
          if ((((iVar1 != 0) && (pRepr->Value == 0xffffffff)) &&
              (iVar1 = Gia_ObjFailed(p,fDisproved), iVar1 == 0)) &&
             ((pGVar5 = Gia_ObjFanin0(pRepr), pGVar5->Value != 0xffffffff &&
              (pGVar5 = Gia_ObjFanin1(pRepr), pGVar5->Value != 0xffffffff)))) {
            iVar1 = Gia_ObjProved(p,fDisproved);
            if ((iVar1 != 0) || (iVar1 = Gia_ObjFailed(p,fDisproved), iVar1 != 0)) {
              __assert_fail("!Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSat.c"
                            ,0x3c7,
                            "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)");
            }
            pGVar6 = pMan_00->pNew;
            iVar1 = Gia_ObjFanin0Copy(pRepr);
            iVar2 = Gia_ObjFanin1Copy(pRepr);
            uVar3 = Gia_ManHashAnd(pGVar6,iVar1,iVar2);
            pRepr->Value = uVar3;
            iVar1 = Vec_IntSize(&pMan_00->pNew->vCopies2);
            iVar2 = Abc_Lit2Var(pRepr->Value);
            if (iVar1 == iVar2) {
              pGVar6 = pMan_00->pNew;
              iVar1 = Abc_Lit2Var(pRepr->Value);
              pGVar5 = Gia_ManObj(pGVar6,iVar1);
              uVar3 = Gia_ObjIsMuxType(pGVar5);
              *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | ((ulong)uVar3 & 1) << 0x1e;
              Gia_ObjSetPhase(pMan_00->pNew,pGVar5);
              Vec_IntPush(&pMan_00->pNew->vCopies2,-1);
            }
            iVar1 = Vec_IntSize(&pMan_00->pNew->vCopies2);
            iVar2 = Gia_ManObjNum(pMan_00->pNew);
            if (iVar1 != iVar2) {
              __assert_fail("Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSat.c"
                            ,0x3d1,
                            "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)");
            }
            pGVar5 = Gia_ObjReprObj(p,fDisproved);
            if ((pGVar5 != (Gia_Obj_t *)0x0) && (pGVar5->Value != 0xffffffff)) {
              iVar1 = Abc_Lit2Var(pRepr->Value);
              iVar2 = Abc_Lit2Var(pGVar5->Value);
              if (iVar1 == iVar2) {
                if ((pRepr->Value ^ pGVar5->Value) !=
                    ((uint)((ulong)*(undefined8 *)pRepr >> 0x20) ^
                    (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20)) >> 0x1f) {
                  __assert_fail("(pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSat.c"
                                ,0x3d7,
                                "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)"
                               );
                }
                Gia_ObjSetProved(p,fDisproved);
              }
              else {
                iVar1 = Cec2_ManSweepNode(pMan_00,fDisproved);
                if (iVar1 == 0) {
                  pRepr->Value = 0xffffffff;
                  p_00 = pMan_00->vCexTriples;
                  iVar1 = Gia_ObjId(p,pGVar5);
                  iVar2 = Abc_Var2Lit(p->iPatsPi,
                                      ((uint)((ulong)*(undefined8 *)pRepr >> 0x20) ^
                                      (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20)) >> 0x1f);
                  Vec_IntPushThree(p_00,iVar1,fDisproved,iVar2);
                  bVar9 = true;
                }
                else {
                  iVar1 = Gia_ObjProved(p,fDisproved);
                  if (iVar1 != 0) {
                    uVar3 = Abc_LitNotCond(pGVar5->Value,
                                           ((uint)((ulong)*(undefined8 *)pRepr >> 0x20) ^
                                           (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20)) >> 0x1f);
                    pRepr->Value = uVar3;
                  }
                }
              }
            }
          }
          fDisproved = fDisproved + 1;
        }
        if (bVar9) {
          uVar3 = Cec2_ManSimulate(p,pMan_00->vCexTriples,pMan_00);
          if ((uVar3 != 0) && (pPars->fVerbose != 0)) {
            printf("Failed to resimulate %d times with pattern = %d  (total = %d).\n",(ulong)uVar3,
                   (ulong)(uint)pMan_00->nPatterns);
          }
          if ((pPars->fIsMiter != 0) && (iVar1 = Cec2_ManSimulateCos(p), iVar1 == 0)) break;
        }
        Cec2_ManPrintStats(p,pPars,pMan_00);
        Fails = Fails + 1;
      }
      if (ppNew != (Gia_Man_t **)0x0) {
        fDisproved = 0;
        while( true ) {
          bVar9 = false;
          if (fDisproved < p->nObjs) {
            pRepr = Gia_ManObj(p,fDisproved);
            bVar9 = pRepr != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          iVar1 = Gia_ObjIsAnd(pRepr);
          if ((iVar1 != 0) && (pRepr->Value == 0xffffffff)) {
            pGVar6 = pMan_00->pNew;
            iVar1 = Gia_ObjFanin0Copy(pRepr);
            iVar2 = Gia_ObjFanin1Copy(pRepr);
            uVar3 = Gia_ManHashAnd(pGVar6,iVar1,iVar2);
            pRepr->Value = uVar3;
          }
          fDisproved = fDisproved + 1;
        }
        fDisproved = 0;
        while( true ) {
          iVar1 = Vec_IntSize(p->vCos);
          bVar9 = false;
          if (fDisproved < iVar1) {
            pRepr = Gia_ManCo(p,fDisproved);
            bVar9 = pRepr != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          pGVar6 = pMan_00->pNew;
          iVar1 = Gia_ObjFanin0Copy(pRepr);
          uVar3 = Gia_ManAppendCo(pGVar6,iVar1);
          pRepr->Value = uVar3;
          fDisproved = fDisproved + 1;
        }
        pGVar6 = Gia_ManCleanup(pMan_00->pNew);
        *ppNew = pGVar6;
        pcVar7 = Abc_UtilStrsav(p->pName);
        (*ppNew)->pName = pcVar7;
        pcVar7 = Abc_UtilStrsav(p->pSpec);
        (*ppNew)->pSpec = pcVar7;
      }
    }
  }
  else {
    fDisproved = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (fDisproved < iVar1) {
        pRepr = Gia_ManCo(p,fDisproved);
        bVar8 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) goto LAB_007fab81;
      if (*(long *)pRepr < 0) break;
      fDisproved = fDisproved + 1;
    }
    pAVar4 = Cec2_ManDeriveCex(p,fDisproved,-1);
    p->pCexSeq = pAVar4;
  }
LAB_007fb269:
  Cec2_ManDestroy(pMan_00);
  return (uint)(p->pCexSeq == (Abc_Cex_t *)0x0);
}

Assistant:

int Cec2_ManPerformSweeping( Gia_Man_t * p, Cec2_Par_t * pPars, Gia_Man_t ** ppNew )
{
    Cec2_Man_t * pMan = Cec2_ManCreate( p, pPars ); 
    Gia_Obj_t * pObj, * pRepr, * pObjNew; 
    int i, Iter, fDisproved = 1;

    // check if any output trivially fails under all-0 pattern
    Gia_ManRandomW( 1 );
    Gia_ManSetPhase( p );
    if ( pPars->fIsMiter ) 
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( pObj->fPhase )
            {
                p->pCexSeq = Cec2_ManDeriveCex( p, i, -1 );
                goto finalize;
            }
    }

    // simulate one round and create classes
    Cec2_ManSimAlloc( p, pPars->nSimWords );
    Cec2_ManSimulateCis( p );
    Cec2_ManSimulate( p, NULL, pMan );
    if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
        goto finalize;
    Cec2_ManCreateClasses( p, pMan );
    Cec2_ManPrintStats( p, pPars, pMan );

    // perform additinal simulation
    for ( i = 0; i < pPars->nSimRounds; i++ )
    {
        Cec2_ManSimulateCis( p );
        Cec2_ManSimulate( p, NULL, pMan );
        if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
            goto finalize;
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // perform sweeping
    //pMan = Cec2_ManCreate( p, pPars );
    for ( Iter = 0; fDisproved && Iter < pPars->nItersMax; Iter++ )
    {
        fDisproved = 0;
        pMan->nPatterns = 0;
        Cec2_ManSimulateCis( p );
        Vec_IntClear( pMan->vCexTriples );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( ~pObj->Value || Gia_ObjFailed(p, i) ) // skip swept nodes and failed nodes
                continue;
            if ( !~Gia_ObjFanin0(pObj)->Value || !~Gia_ObjFanin1(pObj)->Value ) // skip fanouts of non-swept nodes
                continue;
            assert( !Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i) );
            // duplicate the node
            pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Vec_IntSize(&pMan->pNew->vCopies2) == Abc_Lit2Var(pObj->Value) )
            {
                pObjNew = Gia_ManObj( pMan->pNew, Abc_Lit2Var(pObj->Value) );
                pObjNew->fMark0 = Gia_ObjIsMuxType( pObjNew );
                Gia_ObjSetPhase( pMan->pNew, pObjNew );
                Vec_IntPush( &pMan->pNew->vCopies2, -1 );
            }
            assert( Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew) );
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL || !~pRepr->Value )
                continue;
            if ( Abc_Lit2Var(pObj->Value) == Abc_Lit2Var(pRepr->Value) )
            {
                assert( (pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase) );
                Gia_ObjSetProved( p, i );
                continue;
            }
            if ( Cec2_ManSweepNode(pMan, i) )
            {
                if ( Gia_ObjProved(p, i) )
                    pObj->Value = Abc_LitNotCond( pRepr->Value, pObj->fPhase ^ pRepr->fPhase );
                continue;
            }
            pObj->Value = ~0;
            Vec_IntPushThree( pMan->vCexTriples, Gia_ObjId(p, pRepr), i, Abc_Var2Lit(p->iPatsPi, pObj->fPhase ^ pRepr->fPhase) );
            fDisproved = 1;
        }
        if ( fDisproved )
        {
            int Fails = Cec2_ManSimulate( p, pMan->vCexTriples, pMan );
            if ( Fails && pPars->fVerbose )
                printf( "Failed to resimulate %d times with pattern = %d  (total = %d).\n", Fails, pMan->nPatterns, pPars->nSimWords * 64 );
            if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
                break;
        }
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // finish the AIG, if it is not finished
    if ( ppNew )
    {
        Gia_ManForEachAnd( p, pObj, i )
            if ( !~pObj->Value ) 
                pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        *ppNew = Gia_ManCleanup( pMan->pNew );
        (*ppNew)->pName = Abc_UtilStrsav( p->pName );
        (*ppNew)->pSpec = Abc_UtilStrsav( p->pSpec );
    }
finalize:
    Cec2_ManDestroy( pMan );
    //Gia_ManEquivPrintClasses( p, 1, 0 );
    return p->pCexSeq ? 0 : 1;
}